

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManComputeOverlap2One_rec(Gia_Man_t *p,int iObj,Vec_Str_t *vLabel,Vec_Int_t *vVisit)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj_00;
  int Counter;
  Gia_Obj_t *pObj;
  Vec_Int_t *vVisit_local;
  Vec_Str_t *vLabel_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  cVar1 = Vec_StrEntry(vLabel,iObj);
  if (cVar1 == '\0') {
    Vec_StrWriteEntry(vLabel,iObj,'\x01');
    pObj_00 = Gia_ManObj(p,iObj);
    iVar2 = Gia_ObjIsAnd(pObj_00);
    if (iVar2 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                    ,0x133,
                    "int Gia_ManComputeOverlap2One_rec(Gia_Man_t *, int, Vec_Str_t *, Vec_Int_t *)")
      ;
    }
    iVar2 = Gia_ObjFaninId0(pObj_00,iObj);
    iVar2 = Gia_ManComputeOverlap2One_rec(p,iVar2,vLabel,vVisit);
    iVar3 = Gia_ObjFaninId1(pObj_00,iObj);
    iVar3 = Gia_ManComputeOverlap2One_rec(p,iVar3,vLabel,vVisit);
    Vec_IntPush(vVisit,iObj);
    p_local._4_4_ = iVar3 + iVar2 + 1;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManComputeOverlap2One_rec( Gia_Man_t * p, int iObj, Vec_Str_t * vLabel, Vec_Int_t * vVisit )
{
    Gia_Obj_t * pObj;
    int Counter;
    if ( Vec_StrEntry(vLabel, iObj) )
        return 0;
    Vec_StrWriteEntry( vLabel, iObj, 1 );
    pObj = Gia_ManObj( p, iObj );
    assert( Gia_ObjIsAnd(pObj) );
    Counter  = Gia_ManComputeOverlap2One_rec( p, Gia_ObjFaninId0(pObj, iObj), vLabel, vVisit );
    Counter += Gia_ManComputeOverlap2One_rec( p, Gia_ObjFaninId1(pObj, iObj), vLabel, vVisit );
    Vec_IntPush( vVisit, iObj );
    return Counter + 1;
}